

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dist.c
# Opt level: O0

double bfrac(double x,double a,double b,int *ctr)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  int local_9c;
  double dStack_98;
  int m;
  double del;
  double a2m;
  double a1m;
  double delta;
  double g0;
  double g;
  double bm;
  double am;
  double b1;
  double a1;
  double b0;
  double a0;
  double d2m1;
  double d2m;
  int *ctr_local;
  double b_local;
  double a_local;
  double x_local;
  
  local_9c = 1;
  g0 = 1.0;
  g = 1.0;
  bm = 1.0;
  dStack_98 = 1.0 - ((a + b) * x) / (a + 1.0);
  a1m = 1.0;
  while (dVar1 = eps(g0), dVar1 * 1000.0 < a1m && local_9c < 1000) {
    dVar1 = a + (double)local_9c;
    dVar2 = dVar1 + (double)local_9c;
    dVar3 = ((double)local_9c * (b - (double)local_9c) * x) / (dVar2 * (dVar2 - 1.0));
    dVar1 = (-dVar1 * (dVar1 + b) * x) / (dVar2 * (dVar2 + 1.0));
    dVar2 = dVar3 * bm + g0;
    dVar3 = dVar3 * g + dStack_98;
    dVar4 = dVar1 * dStack_98 + dVar3;
    if (local_9c == 1) {
      dStack_98 = 1.0;
    }
    bm = dVar2 / dVar4;
    g = dVar3 / dVar4;
    dVar4 = (dVar1 * g0 + dVar2) / dVar4;
    local_9c = local_9c + 1;
    a1m = ABS(dVar4 - g0);
    g0 = dVar4;
  }
  *ctr = local_9c;
  return g0;
}

Assistant:

double bfrac(double x,double a, double b, int* ctr) {
	double d2m,d2m1,a0,b0,a1,b1,am,bm,g,g0,delta,a1m,a2m,del;
	int m;
	
	/* This continued fraction computation is based on
	 * equation 26.5.8 Handbook of Mathematical Functions.
	 * by Abramowitz and Stegun. 
	 * If convergence is not achieved in 1000 iterations then
	 * the function will still return values so it is recommended
	 * that calling function 
	 * 
	 * y = bfrac(x,a,b,&controlint)
	 * 
	 * should check controlint and discard the result y
	 * if controlint = 1000.
	 * 
	 */ 
	 m = 1;
	 am = bm = g = 1.;
	 a0 = b0 = a1 = b1 = g0 = 0.;
	 del = 1. - (a+b) * x / (a+1);
	 delta = fabs(g - g0);
	 
	 while ( (delta > 1000*eps(g) ) && (m < 1000) ) {
		 a1m = (double) a + m;
		 a2m = (double) a1m + m;
		 g0 = g;
		 d2m = m * (b - m) * x / (a2m * (a2m - 1.));
		 d2m1 = - a1m * (a1m + b) * x / (a2m * (a2m + 1.));
		 
		 
		 a0 = g + d2m * am;
		 b0 = del + d2m * bm;
		 a1 = a0 + d2m1 * g;
		 b1 = b0 + d2m1 * del;
		 if (m == 1) {
			 del = 1.0;
		 }
		 
		 am = a0 / b1;
		 bm = b0 / b1;
		 g = a1/b1;
		 
		 m++;
		 delta = fabs(g - g0);
	 }
	 
	 *ctr = m;
	 return g;
}